

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::~programDefinition
          (programDefinition *this)

{
  if ((this->m_program_object_id != 0) && (this->m_gl != (Functions *)0x0)) {
    (*this->m_gl->deleteProgram)(this->m_program_object_id);
    this->m_program_object_id = 0;
    this->m_gl = (Functions *)0x0;
  }
  return;
}

Assistant:

TextureCubeMapArraySamplingTest::programDefinition::~programDefinition()
{
	if (m_invalid_program_object_id != m_program_object_id)
	{
		if (0 != m_gl)
		{
			m_gl->deleteProgram(m_program_object_id);
			m_program_object_id = m_invalid_program_object_id;
			m_gl				= 0;
		}
	}
}